

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdaccount.cc
# Opt level: O0

void __thiscall bdAccount::resetStats(bdAccount *this)

{
  reference pvVar1;
  int local_14;
  int i;
  bdAccount *this_local;
  
  for (local_14 = 0; local_14 < this->mNoStats; local_14 = local_14 + 1) {
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](&this->mLpfOut,(long)local_14)
    ;
    *pvVar1 = 0.0;
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&this->mLpfRecv,(long)local_14);
    *pvVar1 = 0.0;
  }
  resetCounters(this);
  return;
}

Assistant:

void bdAccount::resetStats() {
	int i;
	for (i = 0; i < mNoStats; i++) {
		mLpfOut[i] = 0;
		mLpfRecv[i] = 0;
	}
	resetCounters();
}